

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

void __thiscall
ASDCP::MXF::StereoscopicPictureSubDescriptor::StereoscopicPictureSubDescriptor
          (StereoscopicPictureSubDescriptor *this,StereoscopicPictureSubDescriptor *rhs)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  InterchangeObject::InterchangeObject
            (&this->super_InterchangeObject,(rhs->super_InterchangeObject).m_Dict);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__InterchangeObject_00218358;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_StereoscopicPictureSubDescriptor);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    local_28 = (undefined4)uVar1;
    uStack_24 = (undefined4)((ulong)uVar1 >> 0x20);
    uStack_20 = (undefined4)uVar2;
    uStack_1c = (undefined4)((ulong)uVar2 >> 0x20);
    *(undefined4 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = local_28;
    *(undefined4 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 4) =
         uStack_24;
    *(undefined4 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uStack_20;
    *(undefined4 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 0xc) =
         uStack_1c;
    (*(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket[0x12])(this,rhs);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xdaf,
                "ASDCP::MXF::StereoscopicPictureSubDescriptor::StereoscopicPictureSubDescriptor(const StereoscopicPictureSubDescriptor &)"
               );
}

Assistant:

StereoscopicPictureSubDescriptor::StereoscopicPictureSubDescriptor(const StereoscopicPictureSubDescriptor& rhs) : InterchangeObject(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_StereoscopicPictureSubDescriptor);
  Copy(rhs);
}